

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Core.cpp
# Opt level: O3

int __thiscall RenX::Core::think(Core *this)

{
  int iVar1;
  iterator __position;
  
  __position._M_current =
       (this->m_servers).
       super__Vector_base<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>,_std::allocator<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (__position._M_current !=
      (this->m_servers).
      super__Vector_base<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>,_std::allocator<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      iVar1 = (**((((__position._M_current)->_M_t).
                   super___uniq_ptr_impl<RenX::Server,_std::default_delete<RenX::Server>_>._M_t.
                   super__Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>.
                   super__Head_base<0UL,_RenX::Server_*,_false>._M_head_impl)->super_Thinker).
                 _vptr_Thinker)();
      if (iVar1 == 0) {
        __position._M_current = __position._M_current + 1;
      }
      else {
        __position = std::
                     vector<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>,_std::allocator<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>_>_>
                     ::_M_erase(&this->m_servers,__position);
      }
    } while (__position._M_current !=
             (this->m_servers).
             super__Vector_base<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>,_std::allocator<std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  iVar1 = Jupiter::Plugin::think();
  return iVar1;
}

Assistant:

int RenX::Core::think() {
	for (auto itr = m_servers.begin(); itr != m_servers.end();) {
		if ((*itr)->think() != 0) {
			itr = m_servers.erase(itr);
			continue;
		}
		++itr;
	}

	return Jupiter::Plugin::think();
}